

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nonrecursive_maximum_likelihood_parameter_generation.cc
# Opt level: O2

bool __thiscall
sptk::NonrecursiveMaximumLikelihoodParameterGeneration::Run
          (NonrecursiveMaximumLikelihoodParameterGeneration *this,
          vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
          *mean_vectors,
          vector<sptk::SymmetricMatrix,_std::allocator<sptk::SymmetricMatrix>_> *covariance_matrices
          ,vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
           *smoothed_static_parameters)

{
  _Vector_impl_data *p_Var1;
  double dVar2;
  pointer pSVar3;
  long lVar4;
  bool bVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  double *g;
  ulong uVar9;
  ulong uVar10;
  size_type __new_size;
  long lVar11;
  double *pdVar12;
  ulong uVar13;
  ulong uVar14;
  pointer pvVar15;
  pointer pdVar16;
  int k;
  uint uVar17;
  int column;
  ulong uVar18;
  bool bVar19;
  int outer_size;
  size_type __n;
  long lVar20;
  pointer *ppdVar21;
  ulong uVar22;
  uint uVar23;
  long *plVar24;
  double *pdVar25;
  int *piVar26;
  undefined8 *puVar27;
  int absolute_t;
  ulong uVar28;
  size_type sVar29;
  vector<sptk::SymmetricMatrix,_std::allocator<sptk::SymmetricMatrix>_> *pvVar30;
  ulong uVar31;
  long lVar32;
  long lVar33;
  long lVar34;
  int i;
  size_type sVar35;
  long lVar36;
  long lVar37;
  int l;
  uint uVar38;
  pointer pvVar39;
  double dVar40;
  reference rVar41;
  _Bit_iterator __first;
  _Bit_iterator __last;
  double local_230;
  int local_228;
  int local_220;
  long local_200;
  ulong local_1f0;
  long local_1d8;
  Row local_1c0;
  ulong local_1a8;
  size_type local_1a0;
  long local_198;
  size_type local_190;
  vector<sptk::SymmetricMatrix,_std::allocator<sptk::SymmetricMatrix>_> *local_188;
  long local_180;
  long local_178;
  SymmetricMatrix precision;
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  wuw;
  vector<double,_std::allocator<double>_> wum;
  vector<sptk::SymmetricMatrix,_std::allocator<sptk::SymmetricMatrix>_> vseq;
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  mseq;
  vector<bool,_std::allocator<bool>_> is_continuous;
  vector<double,_std::allocator<double>_> cc;
  vector<double,_std::allocator<double>_> gg;
  
  if (this->is_valid_ == true) {
    pvVar15 = (mean_vectors->
              super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
              )._M_impl.super__Vector_impl_data._M_start;
    pvVar39 = (mean_vectors->
              super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
              )._M_impl.super__Vector_impl_data._M_finish;
    if (pvVar15 != pvVar39) {
      uVar9 = ((long)pvVar39 - (long)pvVar15) / 0x18;
      uVar18 = 0;
      if (smoothed_static_parameters ==
          (vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
           *)0x0) goto LAB_00112bc6;
      pSVar3 = (covariance_matrices->
               super__Vector_base<sptk::SymmetricMatrix,_std::allocator<sptk::SymmetricMatrix>_>).
               _M_impl.super__Vector_impl_data._M_start;
      uVar13 = (long)(covariance_matrices->
                     super__Vector_base<sptk::SymmetricMatrix,_std::allocator<sptk::SymmetricMatrix>_>
                     )._M_impl.super__Vector_impl_data._M_finish - (long)pSVar3;
      if (uVar9 != (long)uVar13 >> 6) goto LAB_00112bc6;
      uVar10 = ((long)(this->window_coefficients_).
                      super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish -
               (long)(this->window_coefficients_).
                     super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start) / 0x18;
      local_198 = (long)this->num_order_;
      uVar23 = this->num_order_ + 1;
      uVar38 = uVar23 * (int)uVar10;
      uVar14 = 0;
      iVar8 = (int)uVar9;
      if (0 < iVar8) {
        uVar14 = uVar9 & 0xffffffff;
      }
      ppdVar21 = &(pvVar15->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                  super__Vector_impl_data._M_finish;
      uVar9 = 0xffffffffffffffff;
      do {
        uVar28 = uVar14;
        if (uVar9 - uVar14 == -1) break;
        pdVar16 = *ppdVar21;
        p_Var1 = (_Vector_impl_data *)(ppdVar21 + -1);
        uVar28 = uVar9 + 1;
        ppdVar21 = ppdVar21 + 3;
        uVar9 = uVar28;
      } while (uVar38 == (uint)((ulong)((long)pdVar16 - (long)p_Var1->_M_start) >> 3));
      sVar35 = (size_type)iVar8;
      uVar18 = 0;
      if ((long)uVar28 < (long)sVar35) goto LAB_00112bc6;
      uVar13 = uVar13 >> 6;
      iVar6 = (int)uVar13;
      if (0 < iVar6) {
        uVar18 = uVar13 & 0xffffffff;
      }
      uVar9 = 0xffffffffffffffff;
      piVar26 = &pSVar3->num_dimension_;
      do {
        uVar13 = uVar18;
        if (uVar9 - uVar18 == -1) break;
        uVar13 = uVar9 + 1;
        uVar17 = *piVar26;
        uVar9 = uVar13;
        piVar26 = piVar26 + 0x10;
      } while (uVar17 == uVar38);
      if ((long)iVar6 <= (long)uVar13) {
        precision._vptr_SymmetricMatrix =
             (_func_int **)CONCAT71(precision._vptr_SymmetricMatrix._1_7_,1);
        local_188 = covariance_matrices;
        std::vector<bool,_std::allocator<bool>_>::vector
                  (&is_continuous,sVar35,(bool *)&precision,(allocator_type *)&mseq);
        if (this->use_magic_number_ == true) {
          lVar32 = 0;
          for (sVar29 = 0; uVar14 != sVar29; sVar29 = sVar29 + 1) {
            pdVar12 = *(double **)
                       ((long)&(((mean_vectors->
                                 super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                                 )._M_impl.super__Vector_impl_data._M_start)->
                               super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                               super__Vector_impl_data + lVar32);
            if ((this->magic_number_ == *pdVar12) && (!NAN(this->magic_number_) && !NAN(*pdVar12)))
            {
              rVar41 = std::vector<bool,_std::allocator<bool>_>::operator[](&is_continuous,sVar29);
              *rVar41._M_p = *rVar41._M_p & ~rVar41._M_mask;
            }
            lVar32 = lVar32 + 0x18;
          }
        }
        precision._vptr_SymmetricMatrix =
             (_func_int **)CONCAT71(precision._vptr_SymmetricMatrix._1_7_,1);
        __first.super__Bit_iterator_base._8_8_ = 0;
        __first.super__Bit_iterator_base._M_p =
             is_continuous.super__Bvector_base<std::allocator<bool>_>._M_impl.
             super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p;
        __last.super__Bit_iterator_base._12_4_ = 0;
        __last.super__Bit_iterator_base._M_p =
             is_continuous.super__Bvector_base<std::allocator<bool>_>._M_impl.
             super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_p;
        __last.super__Bit_iterator_base._M_offset =
             is_continuous.super__Bvector_base<std::allocator<bool>_>._M_impl.
             super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_offset;
        uVar9 = std::__count_if<std::_Bit_iterator,__gnu_cxx::__ops::_Iter_equals_val<bool_const>>
                          (__first,__last,(_Iter_equals_val<const_bool>)&precision);
        local_220 = this->max_half_window_width_;
        std::vector<double,_std::allocator<double>_>::vector
                  ((vector<double,_std::allocator<double>_> *)&precision,(long)(int)uVar38,
                   (allocator_type *)&vseq);
        local_228 = (int)uVar9;
        std::
        vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
        ::vector(&mseq,(long)local_228,(value_type *)&precision,(allocator_type *)&wum);
        std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
                  ((_Vector_base<double,_std::allocator<double>_> *)&precision);
        SymmetricMatrix::SymmetricMatrix(&precision,uVar38);
        std::vector<sptk::SymmetricMatrix,_std::allocator<sptk::SymmetricMatrix>_>::vector
                  (&vseq,(long)local_228,&precision,(allocator_type *)&wum);
        uVar17 = uVar23 * local_228;
        SymmetricMatrix::~SymmetricMatrix(&precision);
        local_1a0 = (size_type)(int)uVar17;
        std::vector<double,_std::allocator<double>_>::vector
                  (&wum,local_1a0,(allocator_type *)&precision);
        __new_size = (size_type)(int)uVar23;
        __n = ((long)local_220 * 2 + 1) * __new_size;
        std::vector<double,_std::allocator<double>_>::vector
                  ((vector<double,_std::allocator<double>_> *)&precision,__n,(allocator_type *)&gg);
        sVar29 = local_1a0;
        std::
        vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
        ::vector(&wuw,local_1a0,(value_type *)&precision,(allocator_type *)&cc);
        std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
                  ((_Vector_base<double,_std::allocator<double>_> *)&precision);
        std::vector<double,_std::allocator<double>_>::vector
                  (&gg,sVar29,(allocator_type *)&precision);
        std::vector<double,_std::allocator<double>_>::vector
                  (&cc,sVar29,(allocator_type *)&precision);
        if (((long)(smoothed_static_parameters->
                   super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                   )._M_impl.super__Vector_impl_data._M_finish -
            (long)(smoothed_static_parameters->
                  super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                  )._M_impl.super__Vector_impl_data._M_start) / 0x18 != sVar35) {
          std::
          vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
          ::resize(smoothed_static_parameters,sVar35);
        }
        local_220 = local_220 * 2;
        for (lVar32 = 0; uVar14 * 0x18 - lVar32 != 0; lVar32 = lVar32 + 0x18) {
          pvVar15 = (smoothed_static_parameters->
                    super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                    )._M_impl.super__Vector_impl_data._M_start;
          if (*(long *)((long)&(pvVar15->super__Vector_base<double,_std::allocator<double>_>).
                               _M_impl.super__Vector_impl_data + lVar32 + 8) -
              *(long *)((long)&(pvVar15->super__Vector_base<double,_std::allocator<double>_>).
                               _M_impl.super__Vector_impl_data + lVar32) >> 3 != __new_size) {
            std::vector<double,_std::allocator<double>_>::resize
                      ((vector<double,_std::allocator<double>_> *)
                       ((long)&(pvVar15->super__Vector_base<double,_std::allocator<double>_>).
                               _M_impl.super__Vector_impl_data + lVar32),__new_size);
          }
        }
        local_178 = (long)iVar8;
        local_180 = (long)local_228;
        sVar35 = 0;
        uVar18 = (ulong)uVar38;
        if ((int)uVar38 < 1) {
          uVar18 = sVar35;
        }
        iVar8 = 0;
        while( true ) {
          local_190 = sVar35;
          if (sVar35 == uVar14) break;
          rVar41 = std::vector<bool,_std::allocator<bool>_>::operator[](&is_continuous,sVar35);
          if ((*rVar41._M_p & rVar41._M_mask) != 0) {
            SymmetricMatrix::SymmetricMatrix(&precision,0);
            bVar5 = SymmetricMatrix::Invert
                              ((local_188->
                               super__Vector_base<sptk::SymmetricMatrix,_std::allocator<sptk::SymmetricMatrix>_>
                               )._M_impl.super__Vector_impl_data._M_start + sVar35,&precision);
            if (bVar5) {
              lVar32 = *(long *)&(mean_vectors->
                                 super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                                 )._M_impl.super__Vector_impl_data._M_start[sVar35].
                                 super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                 super__Vector_impl_data;
              lVar11 = (long)iVar8;
              for (uVar13 = 0; uVar13 != uVar18; uVar13 = uVar13 + 1) {
                column = (int)uVar13;
                iVar6 = (int)((long)((ulong)(uint)(column >> 0x1f) << 0x20 | uVar13 & 0xffffffff) /
                             (long)(int)uVar23);
                pvVar15 = (this->window_coefficients_).
                          super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start;
                iVar7 = ((int)((ulong)((long)*(pointer *)
                                              ((long)&pvVar15[iVar6].
                                                                                                            
                                                  super__Vector_base<double,_std::allocator<double>_>
                                                  ._M_impl.super__Vector_impl_data + 8) -
                                      *(long *)&pvVar15[iVar6].
                                                super__Vector_base<double,_std::allocator<double>_>.
                                                _M_impl.super__Vector_impl_data) >> 3) + -1) / 2;
                lVar36 = 0;
                bVar19 = false;
                for (lVar33 = (long)-iVar7; lVar33 <= iVar7; lVar33 = lVar33 + 1) {
                  if (((lVar11 + lVar33 < 0) || (local_180 <= lVar11 + lVar33)) ||
                     (((dVar40 = *(double *)
                                  (*(long *)&(this->window_coefficients_).
                                             super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                                             ._M_impl.super__Vector_impl_data._M_start[iVar6].
                                             super__Vector_base<double,_std::allocator<double>_>.
                                             _M_impl.super__Vector_impl_data + lVar36),
                       dVar40 != 0.0 || (NAN(dVar40))) &&
                      (((sVar35 = local_190 + lVar33, -1 < (long)sVar35 &&
                        ((long)sVar35 < local_178)) &&
                       (rVar41 = std::vector<bool,_std::allocator<bool>_>::operator[]
                                           (&is_continuous,sVar35),
                       (*rVar41._M_p & rVar41._M_mask) == 0)))))) {
                    bVar19 = true;
                  }
                  lVar36 = lVar36 + 8;
                }
                if (!bVar19) {
                  local_1c0._vptr_Row = (_func_int **)&PTR__Row_0011eac0;
                  local_1c0.matrix_ = &precision;
                  local_1c0.row_ = column;
                  pdVar12 = SymmetricMatrix::Row::operator[](&local_1c0,column);
                  dVar40 = *pdVar12;
                  mseq.
                  super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start[lVar11].
                  super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_start[uVar13] =
                       *(double *)(lVar32 + uVar13 * 8) * dVar40;
                  local_1c0.matrix_ =
                       vseq.
                       super__Vector_base<sptk::SymmetricMatrix,_std::allocator<sptk::SymmetricMatrix>_>
                       ._M_impl.super__Vector_impl_data._M_start + lVar11;
                  local_1c0._vptr_Row = (_func_int **)&PTR__Row_0011eac0;
                  local_1c0.row_ = column;
                  pdVar12 = SymmetricMatrix::Row::operator[](&local_1c0,column);
                  *pdVar12 = dVar40;
                  for (uVar28 = 0; uVar13 != uVar28; uVar28 = uVar28 + 1) {
                    local_1c0._vptr_Row = (_func_int **)&PTR__Row_0011eac0;
                    local_1c0.matrix_ = &precision;
                    local_1c0.row_ = column;
                    pdVar12 = SymmetricMatrix::Row::operator[](&local_1c0,(int)uVar28);
                    dVar40 = *pdVar12;
                    if ((dVar40 != 0.0) || (NAN(dVar40))) {
                      pdVar16 = mseq.
                                super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_start[lVar11].
                                super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                super__Vector_impl_data._M_start;
                      pdVar16[uVar13] = *(double *)(lVar32 + uVar28 * 8) * dVar40 + pdVar16[uVar13];
                      pdVar16[uVar28] = *(double *)(lVar32 + uVar13 * 8) * dVar40 + pdVar16[uVar28];
                      local_1c0.matrix_ =
                           vseq.
                           super__Vector_base<sptk::SymmetricMatrix,_std::allocator<sptk::SymmetricMatrix>_>
                           ._M_impl.super__Vector_impl_data._M_start + lVar11;
                      local_1c0._vptr_Row = (_func_int **)&PTR__Row_0011eac0;
                      local_1c0.row_ = column;
                      pdVar12 = SymmetricMatrix::Row::operator[](&local_1c0,(int)uVar28);
                      *pdVar12 = dVar40;
                    }
                  }
                }
              }
              iVar8 = iVar8 + 1;
            }
            SymmetricMatrix::~SymmetricMatrix(&precision);
            if (!bVar5) goto LAB_00113816;
          }
          sVar35 = local_190 + 1;
        }
        uVar13 = 0;
        uVar18 = uVar10 & 0xffffffff;
        if ((int)uVar10 < 1) {
          uVar18 = uVar13;
        }
        uVar28 = 0;
        if (0 < local_228) {
          uVar28 = uVar9 & 0xffffffff;
        }
        lVar32 = local_180;
        for (; uVar13 != uVar28; uVar13 = uVar13 + 1) {
          local_1a8 = 0;
          for (uVar9 = 0; (long)uVar9 <= local_198; uVar9 = uVar9 + 1) {
            lVar11 = uVar13 * __new_size + uVar9;
            local_1f0 = local_1a8;
            for (pvVar30 = (vector<sptk::SymmetricMatrix,_std::allocator<sptk::SymmetricMatrix>_> *)
                           0x0;
                pvVar30 !=
                (vector<sptk::SymmetricMatrix,_std::allocator<sptk::SymmetricMatrix>_> *)
                (ulong)uVar23;
                pvVar30 = (vector<sptk::SymmetricMatrix,_std::allocator<sptk::SymmetricMatrix>_> *)
                          ((long)&(pvVar30->
                                  super__Vector_base<sptk::SymmetricMatrix,_std::allocator<sptk::SymmetricMatrix>_>
                                  )._M_impl.super__Vector_impl_data._M_start + 1)) {
              local_188 = pvVar30;
              for (uVar22 = 0; uVar22 != uVar18; uVar22 = uVar22 + 1) {
                pvVar15 = (this->window_coefficients_).
                          super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start;
                lVar33 = *(long *)&pvVar15[uVar22].
                                   super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                   super__Vector_impl_data;
                iVar7 = ((int)((ulong)((long)*(pointer *)
                                              ((long)&pvVar15[uVar22].
                                                                                                            
                                                  super__Vector_base<double,_std::allocator<double>_>
                                                  ._M_impl.super__Vector_impl_data + 8) - lVar33) >>
                              3) + -1) / 2;
                lVar34 = (long)iVar7;
                iVar8 = this->max_half_window_width_;
                iVar6 = (int)pvVar30;
                lVar20 = (long)-iVar7;
                lVar36 = (long)-iVar8;
                local_1d8 = lVar34 * 8 + lVar36 * -8 + lVar33;
                local_200 = -lVar36;
                for (; lVar36 <= iVar8; lVar36 = lVar36 + 1) {
                  lVar37 = lVar36 + uVar13;
                  if ((-1 < lVar37) && (lVar37 < lVar32)) {
                    if ((pvVar30 ==
                         (vector<sptk::SymmetricMatrix,_std::allocator<sptk::SymmetricMatrix>_> *)
                         0x0) && ((lVar20 <= lVar36 && (lVar36 <= lVar34)))) {
                      dVar40 = *(double *)(lVar33 + lVar34 * 8 + lVar36 * -8);
                      if ((dVar40 != 0.0) || (NAN(dVar40))) {
                        wum.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                        super__Vector_impl_data._M_start[lVar11] =
                             dVar40 * mseq.
                                      super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                                      ._M_impl.super__Vector_impl_data._M_start[lVar37].
                                      super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                      super__Vector_impl_data._M_start[uVar22 * __new_size + uVar9]
                             + wum.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                               super__Vector_impl_data._M_start[lVar11];
                      }
                    }
                    local_230 = 0.0;
                    uVar31 = uVar9 & 0xffffffff;
                    for (lVar32 = 0; (uVar10 & 0xffffffff) * 0x18 != lVar32; lVar32 = lVar32 + 0x18)
                    {
                      precision._8_8_ =
                           vseq.
                           super__Vector_base<sptk::SymmetricMatrix,_std::allocator<sptk::SymmetricMatrix>_>
                           ._M_impl.super__Vector_impl_data._M_start + lVar37;
                      precision._vptr_SymmetricMatrix = (_func_int **)&PTR__Row_0011eac0;
                      precision.data_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_start._0_4_ = (int)uVar31;
                      pdVar12 = SymmetricMatrix::Row::operator[]
                                          ((Row *)&precision,iVar6 + (int)(uVar22 * __new_size));
                      pvVar15 = (this->window_coefficients_).
                                super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_start;
                      lVar4 = *(long *)((long)&(pvVar15->
                                               super__Vector_base<double,_std::allocator<double>_>).
                                               _M_impl.super__Vector_impl_data + lVar32);
                      iVar8 = ((int)((ulong)(*(long *)((long)&(pvVar15->
                                                                                                                            
                                                  super__Vector_base<double,_std::allocator<double>_>
                                                  )._M_impl.super__Vector_impl_data + lVar32 + 8) -
                                            lVar4) >> 3) + -1) / 2;
                      if ((-iVar8 <= lVar36) && (lVar36 <= iVar8)) {
                        dVar40 = *(double *)(lVar4 + (long)iVar8 * 8 + lVar36 * -8);
                        if ((dVar40 != 0.0) || (NAN(dVar40))) {
                          dVar2 = *pdVar12;
                          if ((dVar2 != 0.0) || (NAN(dVar2))) {
                            local_230 = local_230 + dVar40 * dVar2;
                          }
                        }
                      }
                      uVar31 = (ulong)((int)uVar31 + uVar23);
                    }
                    lVar32 = local_180;
                    pvVar30 = local_188;
                    if ((local_230 != 0.0) || (NAN(local_230))) {
                      uVar38 = (uint)local_1f0;
                      for (lVar37 = 0;
                          (lVar37 <= local_220 && ((long)(uVar13 + lVar37) < local_180));
                          lVar37 = lVar37 + 1) {
                        if ((lVar20 <= local_200 + lVar37) && (local_200 + lVar37 <= lVar34)) {
                          dVar40 = *(double *)(local_1d8 + lVar37 * 8);
                          if (((dVar40 != 0.0) || (NAN(dVar40))) && (-1 < (int)uVar38)) {
                            pdVar16 = wuw.
                                      super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                                      ._M_impl.super__Vector_impl_data._M_start[lVar11].
                                      super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                      super__Vector_impl_data._M_start;
                            pdVar16[uVar38] = dVar40 * local_230 + pdVar16[uVar38];
                          }
                        }
                        uVar38 = uVar38 + uVar23;
                      }
                    }
                  }
                  iVar8 = this->max_half_window_width_;
                  local_1d8 = local_1d8 + -8;
                  local_200 = local_200 + -1;
                }
              }
              local_1f0 = (ulong)((uint)local_1f0 + 1);
            }
            local_1a8 = (ulong)((int)local_1a8 - 1);
          }
        }
        uVar18 = 0;
        uVar9 = (ulong)uVar17;
        if ((int)uVar17 < 1) {
          uVar9 = uVar18;
        }
        pvVar15 = wuw.
                  super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start + -1;
        lVar32 = -0x18;
        uVar13 = 1;
        for (; uVar18 != uVar9; uVar18 = uVar18 + 1) {
          puVar27 = (undefined8 *)
                    ((long)&((wuw.
                              super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_start)->
                            super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                            super__Vector_impl_data._M_start + lVar32);
          for (uVar10 = uVar13; ((long)uVar10 < (long)__n && (uVar10 <= uVar18));
              uVar10 = uVar10 + 1) {
            dVar40 = ((double *)*puVar27)[uVar10];
            pdVar12 = wuw.
                      super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start[uVar18].
                      super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_start;
            *pdVar12 = *pdVar12 - dVar40 * dVar40 * *(double *)*puVar27;
            puVar27 = puVar27 + -3;
          }
          pdVar12 = wuw.
                    super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start[uVar18].
                    super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start;
          dVar40 = *pdVar12;
          lVar11 = 0x10;
          lVar33 = 2;
          for (uVar10 = uVar13; uVar28 = uVar13, pvVar39 = pvVar15, (long)uVar10 < (long)__n;
              uVar10 = uVar10 + 1) {
            for (; (uVar28 <= uVar18 && ((long)(lVar33 + uVar28 + -1) < (long)__n));
                uVar28 = uVar28 + 1) {
              pdVar25 = (pvVar39->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                        super__Vector_impl_data._M_start;
              pdVar12[uVar10] =
                   pdVar12[uVar10] -
                   *(double *)((long)pdVar25 + lVar11 + -8 + uVar28 * 8) * pdVar25[uVar28] *
                   *pdVar25;
              pvVar39 = pvVar39 + -1;
            }
            pdVar12[uVar10] = pdVar12[uVar10] * (1.0 / dVar40);
            lVar11 = lVar11 + 8;
            lVar33 = lVar33 + 1;
          }
          lVar32 = lVar32 + 0x18;
          pvVar15 = pvVar15 + 1;
        }
        pdVar12 = gg.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_start + -1;
        lVar32 = -0x18;
        for (uVar18 = 0; uVar18 != uVar9; uVar18 = uVar18 + 1) {
          dVar40 = wum.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_start[uVar18];
          gg.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
          _M_start[uVar18] = dVar40;
          plVar24 = (long *)((long)&((wuw.
                                      super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                                      ._M_impl.super__Vector_impl_data._M_start)->
                                    super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                                    super__Vector_impl_data._M_start + lVar32);
          pdVar25 = pdVar12;
          for (uVar13 = 1; ((long)uVar13 < (long)__n && (uVar13 <= uVar18)); uVar13 = uVar13 + 1) {
            dVar40 = dVar40 - *(double *)(*plVar24 + uVar13 * 8) * *pdVar25;
            gg.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
            _M_start[uVar18] = dVar40;
            pdVar25 = pdVar25 + -1;
            plVar24 = plVar24 + -3;
          }
          pdVar12 = pdVar12 + 1;
          lVar32 = lVar32 + 0x18;
        }
        pdVar16 = cc.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_start + local_1a0;
        sVar35 = local_1a0;
        while (0 < (long)sVar35) {
          sVar29 = sVar35 - 1;
          pdVar12 = wuw.
                    super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start[sVar29].
                    super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start;
          dVar40 = gg.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_start[sVar29] / *pdVar12;
          cc.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
          _M_start[sVar29] = dVar40;
          lVar32 = 0;
          while ((lVar32 + 1 < (long)__n && ((long)(sVar35 + lVar32) < (long)local_1a0))) {
            dVar40 = dVar40 - pdVar12[lVar32 + 1] * pdVar16[lVar32];
            cc.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
            _M_start[sVar29] = dVar40;
            lVar32 = lVar32 + 1;
          }
          pdVar16 = pdVar16 + -1;
          sVar35 = sVar29;
        }
        iVar8 = 0;
        for (sVar35 = 0; sVar35 != uVar14; sVar35 = sVar35 + 1) {
          lVar32 = *(long *)&(smoothed_static_parameters->
                             super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                             )._M_impl.super__Vector_impl_data._M_start[sVar35].
                             super__Vector_base<double,_std::allocator<double>_>._M_impl.
                             super__Vector_impl_data;
          rVar41 = std::vector<bool,_std::allocator<bool>_>::operator[](&is_continuous,sVar35);
          if ((*rVar41._M_p & rVar41._M_mask) == 0) {
            for (lVar11 = 0; lVar11 <= local_198; lVar11 = lVar11 + 1) {
              *(double *)(lVar32 + lVar11 * 8) = this->magic_number_;
            }
          }
          else {
            for (lVar11 = 0; lVar11 <= local_198; lVar11 = lVar11 + 1) {
              *(double *)(lVar32 + lVar11 * 8) =
                   cc.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_start[iVar8 + lVar11];
            }
            iVar8 = iVar8 + (int)lVar11;
          }
        }
LAB_00113816:
        uVar18 = (ulong)(local_178 <= (long)local_190);
        std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
                  (&cc.super__Vector_base<double,_std::allocator<double>_>);
        std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
                  (&gg.super__Vector_base<double,_std::allocator<double>_>);
        std::
        vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
        ::~vector(&wuw);
        std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
                  (&wum.super__Vector_base<double,_std::allocator<double>_>);
        std::vector<sptk::SymmetricMatrix,_std::allocator<sptk::SymmetricMatrix>_>::~vector(&vseq);
        std::
        vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
        ::~vector(&mseq);
        std::_Bvector_base<std::allocator<bool>_>::~_Bvector_base
                  (&is_continuous.super__Bvector_base<std::allocator<bool>_>);
        goto LAB_00112bc6;
      }
    }
  }
  uVar18 = 0;
LAB_00112bc6:
  return SUB81(uVar18,0);
}

Assistant:

bool NonrecursiveMaximumLikelihoodParameterGeneration::Run(
    const std::vector<std::vector<double> >& mean_vectors,
    const std::vector<SymmetricMatrix>& covariance_matrices,
    std::vector<std::vector<double> >* smoothed_static_parameters) const {
  // Check inputs.
  if (!is_valid_ || mean_vectors.empty() ||
      mean_vectors.size() != covariance_matrices.size() ||
      NULL == smoothed_static_parameters) {
    return false;
  }

  const int num_window(static_cast<int>(window_coefficients_.size()));
  const int static_size(num_order_ + 1);
  const int length(static_size * num_window);
  if (!CheckSize(mean_vectors, length) ||
      !CheckSize(covariance_matrices, length)) {
    return false;
  }

  // Store positions that contain a magic number.
  const int sequence_length(static_cast<int>(mean_vectors.size()));
  std::vector<bool> is_continuous(sequence_length, true);
  if (use_magic_number_) {
    for (int absolute_t(0); absolute_t < sequence_length; ++absolute_t) {
      if (magic_number_ == mean_vectors[absolute_t][0]) {
        is_continuous[absolute_t] = false;
      }
    }
  }
  const int continuous_length(static_cast<int>(
      std::count(is_continuous.begin(), is_continuous.end(), true)));

  // Prepare memories.
  const int max_window_width(2 * max_half_window_width_ + 1);
  const int wuw_height(static_size * continuous_length);
  const int wuw_width(static_size * max_window_width);
  std::vector<std::vector<double> > mseq(continuous_length,
                                         std::vector<double>(length));
  std::vector<SymmetricMatrix> vseq(continuous_length, SymmetricMatrix(length));
  std::vector<double> wum(wuw_height);
  std::vector<std::vector<double> > wuw(wuw_height,
                                        std::vector<double>(wuw_width));
  std::vector<double> gg(wuw_height);
  std::vector<double> cc(wuw_height);
  {
    if (smoothed_static_parameters->size() !=
        static_cast<std::size_t>(sequence_length)) {
      smoothed_static_parameters->resize(sequence_length);
    }
    for (int t(0); t < sequence_length; ++t) {
      if ((*smoothed_static_parameters)[t].size() !=
          static_cast<std::size_t>(static_size)) {
        (*smoothed_static_parameters)[t].resize(static_size);
      }
    }
  }

  // Set mseq and vseq.
  for (int absolute_t(0), t(0); absolute_t < sequence_length; ++absolute_t) {
    if (!is_continuous[absolute_t]) continue;

    SymmetricMatrix precision;
    if (!covariance_matrices[absolute_t].Invert(&precision)) {
      return false;
    }
    const double* mean(&(mean_vectors[absolute_t][0]));

    for (int k(0); k < length; ++k) {
      // Check boundary.
      bool is_boundary(false);
      {
        const int d(k / static_size);
        const int half_window_width(
            (static_cast<int>(window_coefficients_[d].size()) - 1) / 2);
        for (int j(-half_window_width); j <= half_window_width; ++j) {
          const int biased_t(t + j);
          const int biased_absolute_t(absolute_t + j);
          const double* window_coefficients(
              &(window_coefficients_[d][half_window_width]));
          if (biased_t < 0 || continuous_length <= biased_t ||
              (0.0 != window_coefficients[j] && 0 <= biased_absolute_t &&
               biased_absolute_t < sequence_length &&
               !is_continuous[biased_absolute_t])) {
            is_boundary = true;
          }
        }
      }

      if (!is_boundary) {
        const double p(precision[k][k]);
        mseq[t][k] = p * mean[k];
        vseq[t][k][k] = p;
        for (int l(0); l < k; ++l) {
          const double q(precision[k][l]);
          if (0.0 != q) {
            mseq[t][k] += q * mean[l];
            mseq[t][l] += q * mean[k];
            vseq[t][k][l] = q;
          }
        }
      }
    }

    // Update counter.
    ++t;
  }

  // Calculate WUM and WUW.
  for (int t(0); t < continuous_length; ++t) {
    for (int m(0); m < static_size; ++m) {
      const int tau(static_size * t + m);
      for (int n(0); n < static_size; ++n) {
        for (int d(0); d < num_window; ++d) {
          const int half_window_width(
              (static_cast<int>(window_coefficients_[d].size()) - 1) / 2);
          const double* window_coefficients(
              &(window_coefficients_[d][half_window_width]));
          for (int j(-max_half_window_width_); j <= max_half_window_width_;
               ++j) {
            const int biased_t(t + j);
            if (biased_t < 0 || continuous_length <= biased_t) continue;

            // Accumulate W'U^{-1}M.
            if (0 == n &&
                CheckRange(j, half_window_width, window_coefficients, true)) {
              wum[tau] += (window_coefficients[-j] *
                           mseq[biased_t][d * static_size + m]);
            }

            // Accumulate W'U^{-1}W.
            double wu(0.0);
            for (int c(0); c < num_window; ++c) {
              const double u(
                  vseq[biased_t][static_size * c + m][static_size * d + n]);
              const int half_window_width2(
                  (static_cast<int>(window_coefficients_[c].size()) - 1) / 2);
              const double* window_coefficients2(
                  &(window_coefficients_[c][half_window_width2]));
              if (CheckRange(j, half_window_width2, window_coefficients2,
                             true) &&
                  0.0 != u) {
                wu += window_coefficients2[-j] * u;
              }
            }
            if (0.0 != wu) {
              for (int k(0); k < max_window_width && t + k < continuous_length;
                   ++k) {
                const int index(static_size * k + n - m);
                if (CheckRange(k - j, half_window_width, window_coefficients,
                               false) &&
                    0 <= index) {
                  wuw[tau][index] += wu * window_coefficients[k - j];
                }
              }
            }
          }
        }
      }
    }
  }

  // Compute Cholesky factor.
  for (int t(0); t < wuw_height; ++t) {
    for (int i(1); i < wuw_width && i <= t; ++i) {
      wuw[t][0] -= wuw[t - i][i] * wuw[t - i][i] * wuw[t - i][0];
    }

    const double z(1.0 / wuw[t][0]);
    for (int i(1); i < wuw_width; ++i) {
      for (int j(1); i + j < wuw_width && j <= t; ++j) {
        wuw[t][i] -= wuw[t - j][j] * wuw[t - j][i + j] * wuw[t - j][0];
      }
      wuw[t][i] *= z;
    }
  }

  // Forward substitution to solve a set of linear equations.
  {
    const double* r(&(wum[0]));
    double* g(&(gg[0]));
    for (int t(0); t < wuw_height; ++t) {
      g[t] = r[t];
      for (int i(1); i < wuw_width && i <= t; ++i) {
        g[t] -= wuw[t - i][i] * g[t - i];
      }
    }
  }

  // Backward substitution to solve a set of linear equations.
  {
    const double* g(&(gg[0]));
    double* c(&(cc[0]));
    for (int t(wuw_height - 1); 0 <= t; --t) {
      c[t] = g[t] / wuw[t][0];
      for (int i(1); i < wuw_width && t + i < wuw_height; ++i) {
        c[t] -= wuw[t][i] * c[t + i];
      }
    }
  }

  // Store generated parameters.
  {
    const double* c(&(cc[0]));
    int u(0);
    for (int absolute_t(0); absolute_t < sequence_length; ++absolute_t) {
      double* C(&((*smoothed_static_parameters)[absolute_t][0]));
      if (is_continuous[absolute_t]) {
        for (int k(0); k < static_size; ++k) {
          C[k] = c[u++];
        }
      } else {
        for (int k(0); k < static_size; ++k) {
          C[k] = magic_number_;
        }
      }
    }
  }

  return true;
}